

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::GeneratedCodeInfo::~GeneratedCodeInfo(GeneratedCodeInfo *this)

{
  InternalMetadata *this_00;
  ulong uVar1;
  LogMessageFatal local_20;
  
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
    uVar1 = this_00->ptr_;
  }
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::~RepeatedPtrField
              (&(this->field_0)._impl_.annotation_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x3caf,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

GeneratedCodeInfo::~GeneratedCodeInfo() {
  // @@protoc_insertion_point(destructor:google.protobuf.GeneratedCodeInfo)
  SharedDtor(*this);
}